

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

double * r8vec_linspace_new(int n,double a_first,double a_last)

{
  double *pdVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  
  uVar3 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar3 = (long)n * 8;
  }
  pdVar1 = (double *)operator_new__(uVar3);
  if (n == 1) {
    *pdVar1 = (a_first + a_last) * 0.5;
  }
  else if (0 < n) {
    iVar2 = n + -1;
    dVar4 = (double)iVar2;
    uVar3 = 0;
    do {
      pdVar1[uVar3] = ((double)iVar2 * a_first + (double)(int)uVar3 * a_last) / dVar4;
      uVar3 = uVar3 + 1;
      iVar2 = iVar2 + -1;
    } while ((uint)n != uVar3);
  }
  return pdVar1;
}

Assistant:

double *r8vec_linspace_new ( int n, double a_first, double a_last )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC_LINSPACE_NEW creates a vector of linearly spaced values.
//
//  Discussion:
//
//    An R8VEC is a vector of R8's.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    29 March 2011
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double A_FIRST, A_LAST, the first and last entries.
//
//    Output, double R8VEC_LINSPACE_NEW[N], a vector of linearly spaced data.
//
{
  double *a;
  int i;

  a = new double[n];

  if ( n == 1 )
  {
    a[0] = ( a_first + a_last ) / 2.0;
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      a[i] = ( double( n - 1 - i ) * a_first 
             + double(         i ) * a_last ) 
             / double( n - 1     );
    }
  }
  return a;
}